

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O3

ssize_t __thiscall
drace::detector::Fasttrack<std::shared_mutex>::write
          (Fasttrack<std::shared_mutex> *this,int __fd,void *__buf,size_t __n)

{
  spinlock *psVar1;
  __int_type_conflict _Var2;
  slot_type ptVar3;
  undefined1 auVar4 [16];
  ssize_t sVar5;
  size_t hash;
  anon_union_8_1_a8a14541_for_iterator_1 aVar6;
  undefined4 in_register_00000034;
  int spin_count;
  uint uVar7;
  raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
  *this_00;
  iterator iVar8;
  unsigned_short local_82;
  size_t local_80;
  _Head_base<0UL,_unsigned_long_&,_false> local_78;
  _Head_base<0UL,_unsigned_short_&&,_false> local_70;
  pair<phmap::container_internal::parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>::iterator,_bool>
  local_68;
  
  StackTrace::set_read_write
            ((StackTrace *)(CONCAT44(in_register_00000034,__fd) + 0x38),__n,(size_t)__buf);
  psVar1 = &this->vars_spl;
  uVar7 = 0;
  do {
    if (((psVar1->_locked)._M_base._M_i & 1U) == 0) {
      LOCK();
      _Var2 = (psVar1->_locked)._M_base._M_i;
      (psVar1->_locked)._M_base._M_i = true;
      UNLOCK();
      if ((_Var2 & 1U) == 0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = __n;
        hash = SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),0);
        uVar7 = (((uint)(hash >> 4) & 0xfffffff ^ (uint)hash) & 0xf) << 6;
        this_00 = (raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                   *)((long)&(this->vars).
                             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                             .
                             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                             .sets_._M_elems[0].set_.ctrl_ + (ulong)uVar7);
        local_68.first.inner_ = (Inner *)__n;
        iVar8 = phmap::container_internal::
                raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                ::find<unsigned_long>(this_00,(key_arg<unsigned_long> *)&local_68,hash);
        aVar6 = iVar8.field_1;
        if (this_00->ctrl_ +
            *(long *)((long)&(this->vars).
                             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                             .
                             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                             .sets_._M_elems[0].set_.capacity_ + (ulong)uVar7) == iVar8.ctrl_) {
          local_78._M_head_impl = &local_80;
          local_70._M_head_impl = &local_82;
          local_80 = __n;
          phmap::container_internal::
          parallel_hash_set<4ul,phmap::container_internal::raw_hash_set,phmap::NullMutex,phmap::container_internal::NodeHashMapPolicy<unsigned_long,VarState>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VarState>>>
          ::
          emplace_decomposable<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<unsigned_short&&>>
                    (&local_68,&this->vars,local_78._M_head_impl,
                     (piecewise_construct_t *)&std::piecewise_construct,
                     (tuple<unsigned_long_&> *)&local_78,(tuple<unsigned_short_&&> *)&local_70);
          aVar6 = local_68.first.it_.field_1;
        }
        ptVar3 = *aVar6.slot_;
        (psVar1->_locked)._M_base._M_i = false;
        psVar1 = &(ptVar3->second).lock;
        uVar7 = 0;
        do {
          if (((psVar1->_locked)._M_base._M_i & 1U) == 0) {
            LOCK();
            _Var2 = (psVar1->_locked)._M_base._M_i;
            (psVar1->_locked)._M_base._M_i = true;
            UNLOCK();
            if ((_Var2 & 1U) == 0) {
              sVar5 = write(this,__fd,&ptVar3->second,__n);
              (psVar1->_locked)._M_base._M_i = false;
              return sVar5;
            }
          }
          if (0xf < uVar7) {
            sched_yield();
          }
          uVar7 = uVar7 + 1;
        } while( true );
      }
    }
    if (0xf < uVar7) {
      sched_yield();
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void write(tls_t tls, void* pc, void* addr, size_t size) final {
    ThreadState* thr = reinterpret_cast<ThreadState*>(tls);
    thr->get_stackDepot().set_read_write((size_t)addr,
                                         reinterpret_cast<size_t>(pc));
    VarState* var;
    {
      std::lock_guard<ipc::spinlock> exLockT(vars_spl);
      auto it = vars.find((size_t)addr);
      if (it == vars.end()) {
        it = create_var((size_t)(addr), size);
      }
      var = &(it->second);
    }
    std::lock_guard<ipc::spinlock> lg(var->lock);
    write(thr, var, (size_t)addr);
  }